

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Gridded_Data_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Gridded_Data_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference this_00;
  GridAxisRegular *pGVar3;
  reference this_01;
  GridData *pGVar4;
  KINT32 Value;
  KINT32 Value_00;
  string local_2d0 [32];
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
  local_2b0;
  const_iterator citrDataEnd;
  const_iterator citrData;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
  local_280;
  const_iterator citrAxisEnd;
  const_iterator citrAxis;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Gridded_Data_PDU *local_18;
  Gridded_Data_PDU *this_local;
  
  local_18 = this;
  this_local = (Gridded_Data_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Gridded Data PDU-\n");
  poVar2 = std::operator<<(poVar2,"Environmental Process ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_EnvProcID);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Field Number: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16FieldNum);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"PDU Number: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16PDUNum);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"PDU Total: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16PDUTotal);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Coordinate System: ");
  DATA_TYPE::ENUMS::GetEnumAsStringCoordinateSystem_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)this->m_ui16CordSys,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Axis: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumAxis);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Constant Grid: ");
  DATA_TYPE::ENUMS::GetEnumAsStringConstantGrid_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)this->m_ui8ConstGrid,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Environment Type: ");
  DATA_TYPE::EnvironmentType::GetAsString_abi_cxx11_(&local_250,&this->m_EnvType);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"Orientation: ");
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_((KString *)&citrAxis,&this->m_Ori);
  poVar2 = std::operator<<(poVar2,(string *)&citrAxis);
  poVar2 = std::operator<<(poVar2,"Sample Time: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui64SampleTime);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Total Values: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui32TotalValues);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Vector Dimension: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8VecDim);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&citrAxis);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrAxisEnd = std::
                vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
                ::begin(&this->m_vpGridAxisDesc);
  local_280._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
       ::end(&this->m_vpGridAxisDesc);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrAxisEnd,&local_280);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
              ::operator*(&citrAxisEnd);
    pGVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>::operator->(this_00);
    (*(pGVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&citrData);
    std::operator<<(local_190,(string *)&citrData);
    std::__cxx11::string::~string((string *)&citrData);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
    ::operator++(&citrAxisEnd);
  }
  citrDataEnd = std::
                vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
                ::begin(&this->m_vGridData);
  local_2b0._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::GridData> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
       ::end(&this->m_vGridData);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrDataEnd,&local_2b0);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
              ::operator*(&citrDataEnd);
    pGVar4 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::operator->(this_01);
    (*(pGVar4->super_DataTypeBase)._vptr_DataTypeBase[2])(local_2d0);
    std::operator<<(local_190,local_2d0);
    std::__cxx11::string::~string(local_2d0);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
    ::operator++(&citrDataEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Gridded_Data_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Gridded Data PDU-\n"
       << "Environmental Process ID:\n"
       << m_EnvProcID.GetAsString()
       << "Field Number: "      << m_ui16FieldNum                                   << "\n"
       << "PDU Number: "        << m_ui16PDUNum                                     << "\n"
       << "PDU Total: "         << m_ui16PDUTotal                                   << "\n"
       << "Coordinate System: " << GetEnumAsStringCoordinateSystem( m_ui16CordSys ) << "\n"
       << "Number Of Axis: "    <<  ( KUINT16 )m_ui8NumAxis                         << "\n"
       << "Constant Grid: "     << GetEnumAsStringConstantGrid( m_ui8ConstGrid )    << "\n"
       << "Environment Type: "  << m_EnvType.GetAsString()
       << "Orientation: "       << m_Ori.GetAsString()
       << "Sample Time: "       << m_ui64SampleTime                                 << "\n"
       << "Total Values: "      << m_ui32TotalValues                                << "\n"
       << "Vector Dimension: "  << ( KUINT16 )m_ui8VecDim                           << "\n";

    vector<GridAxisDescriptor>::const_iterator citrAxis = m_vpGridAxisDesc.begin();
    vector<GridAxisDescriptor>::const_iterator citrAxisEnd = m_vpGridAxisDesc.end();
    for( ; citrAxis != citrAxisEnd; ++citrAxis )
    {
        ss << ( *citrAxis )->GetAsString();
    }

    vector<GridDataPtr>::const_iterator citrData = m_vGridData.begin();
    vector<GridDataPtr>::const_iterator citrDataEnd = m_vGridData.end();
    for( ; citrData != citrDataEnd; ++citrData )
    {
        ss << ( *citrData )->GetAsString();
    }

    return ss.str();
}